

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O3

int tjDecompressToYUVPlanes
              (tjhandle handle,uchar *jpegBuf,unsigned_long jpegSize,uchar **dstPlanes,int width,
              int *strides,int height,int flags)

{
  j_decompress_ptr cinfo;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  void *pvVar9;
  undefined8 *puVar10;
  code **ppcVar11;
  void *pvVar12;
  long lVar13;
  uint uVar14;
  void *pvVar15;
  char *pcVar16;
  uchar *puVar17;
  ulong uVar18;
  int iVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  size_t __n;
  bool bVar23;
  JSAMPROW *tmpbuf [10];
  JSAMPROW *outbuf [10];
  int th [10];
  int crow [10];
  int iw [10];
  int ph [10];
  int pw [10];
  JSAMPARRAY yuvptr [10];
  long local_238 [20];
  uint auStack_198 [12];
  int aiStack_168 [12];
  int aiStack_138 [12];
  uint auStack_108 [12];
  int aiStack_d8 [12];
  JSAMPARRAY local_a8 [10];
  code *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  tjhandle local_38;
  
  if (handle == (tjhandle)0x0) {
    puVar10 = (undefined8 *)__tls_get_addr(&PTR_0019ef20);
    *(undefined8 *)((long)puVar10 + 7) = 0x656c646e616820;
    *puVar10 = 0x2064696c61766e49;
    return -1;
  }
  *(undefined4 *)((long)handle + 0x5f8) = 0;
  *(undefined4 *)((long)handle + 0x6d0) = 0;
  *(uint *)((long)handle + 0x5fc) = (uint)flags >> 0xd & 1;
  local_238[8] = 0;
  local_238[9] = 0;
  local_238[6] = 0;
  local_238[7] = 0;
  local_238[4] = 0;
  local_238[5] = 0;
  local_238[2] = 0;
  local_238[3] = 0;
  local_238[0] = 0;
  local_238[1] = 0;
  local_238[10] = 0;
  local_238[0xb] = 0;
  local_238[0xc] = 0;
  local_238[0xd] = 0;
  local_238[0xe] = 0;
  local_238[0xf] = 0;
  local_238[0x10] = 0;
  local_238[0x11] = 0;
  local_238[0x12] = 0;
  local_238[0x13] = 0;
  cinfo = (j_decompress_ptr)((long)handle + 0x208);
  if ((*(byte *)((long)handle + 0x600) & 2) == 0) {
    memcpy((void *)((long)handle + 0x608),
           "tjDecompressToYUVPlanes(): Instance has not been initialized for decompression",0x4f);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pvVar9 = (void *)__tls_get_addr(&PTR_0019ef20);
    memcpy(pvVar9,"tjDecompressToYUVPlanes(): Instance has not been initialized for decompression",
           0x4f);
  }
  else {
    if (((dstPlanes != (uchar **)0x0 && (jpegSize != 0 && jpegBuf != (uchar *)0x0)) &&
        (-1 < (height | width))) && (*dstPlanes != (uchar *)0x0)) {
      if ((flags & 8U) == 0) {
        if ((flags & 0x10U) != 0) {
          pcVar16 = "JSIMD_FORCESSE=1";
          goto LAB_0013a5c5;
        }
        if ((flags & 0x20U) != 0) {
          pcVar16 = "JSIMD_FORCESSE2=1";
          goto LAB_0013a5c5;
        }
      }
      else {
        pcVar16 = "JSIMD_FORCEMMX=1";
LAB_0013a5c5:
        putenv(pcVar16);
      }
      if ((short)flags < 0) {
        ppcVar11 = &local_58;
        local_50 = 0;
        uStack_48 = 0;
        local_40 = 0;
        local_58 = my_progress_monitor;
        local_38 = handle;
      }
      else {
        ppcVar11 = (code **)0x0;
      }
      *(code ***)((long)handle + 0x218) = ppcVar11;
      iVar3 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
      if (iVar3 != 0) {
        pvVar9 = (void *)0x0;
        uVar6 = 0xffffffff;
        goto LAB_0013a544;
      }
      if (*(int *)((long)handle + 0x604) == 0) {
        jpeg_mem_src_tj(cinfo,jpegBuf,jpegSize);
        jpeg_read_header(cinfo,1);
      }
      *(undefined4 *)((long)handle + 0x604) = 0;
      iVar3 = getSubsamp(cinfo);
      if (iVar3 < 0) {
        pcVar16 = "tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image";
        __n = 0x4f;
      }
      else {
        if ((iVar3 != 3) && ((dstPlanes[1] == (uchar *)0x0 || (dstPlanes[2] == (uchar *)0x0)))) {
          builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
          builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
          builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
          builtin_strncpy((char *)((long)handle + 0x620),"): Inval",8);
          builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
          builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
          builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
          builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
          *(undefined4 *)((long)handle + 0x6d0) = 1;
          pcVar16 = (char *)__tls_get_addr(&PTR_0019ef20);
          builtin_strncpy(pcVar16 + 0x10,"VPlanes(): Invalid argument",0x1c);
          goto LAB_0013a7d9;
        }
        if (width == 0) {
          width = *(int *)((long)handle + 0x238);
        }
        if (height == 0) {
          height = *(int *)((long)handle + 0x23c);
        }
        lVar22 = 0;
        do {
          iVar1 = sf[lVar22].denom;
          if (((sf[lVar22].num * *(int *)((long)handle + 0x238) + iVar1 + -1) / iVar1 <= width) &&
             ((sf[lVar22].num * *(int *)((long)handle + 0x23c) + iVar1 + -1) / iVar1 <= height)) {
            if (3 < *(int *)((long)handle + 0x240)) {
              pcVar16 = "tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components";
              __n = 0x46;
              goto LAB_0013a741;
            }
            iVar1 = sf[lVar22].num;
            iVar2 = sf[lVar22].denom;
            *(int *)((long)handle + 0x24c) = iVar1;
            *(int *)((long)handle + 0x250) = iVar2;
            jpeg_calc_output_dimensions(cinfo);
            iVar4 = (iVar1 * 8) / iVar2;
            bVar23 = true;
            pvVar9 = (void *)0x0;
            if (*(int *)((long)handle + 0x240) < 1) goto LAB_0013ab0e;
            iVar7 = 0;
            pvVar15 = pvVar9;
            goto LAB_0013a86b;
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != 0x10);
        pcVar16 = "tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions";
        __n = 0x4c;
      }
LAB_0013a741:
      memcpy((void *)((long)handle + 0x608),pcVar16,__n);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      pvVar9 = (void *)__tls_get_addr(&PTR_0019ef20);
      memcpy(pvVar9,pcVar16,__n);
      goto LAB_0013a7e0;
    }
    builtin_strncpy((char *)((long)handle + 0x624),"nvalid a",8);
    builtin_strncpy((char *)((long)handle + 0x62c),"rgument",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Inval",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
    builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
    builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
    builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar16 = (char *)__tls_get_addr(&PTR_0019ef20);
    builtin_strncpy(pcVar16,"tjDecompressToYUVPlanes(): Invalid argument",0x2c);
  }
  uVar6 = 0xffffffff;
  pvVar9 = (void *)0x0;
  goto LAB_0013a544;
  while( true ) {
    if (0 < (int)uVar6) {
      puVar17 = dstPlanes[(long)pvVar15];
      uVar18 = 0;
      do {
        *(uchar **)((long)pvVar9 + uVar18 * 8) = puVar17;
        if ((strides == (int *)0x0) || (iVar8 = strides[(long)pvVar15], strides[(long)pvVar15] == 0)
           ) {
          iVar8 = iVar5;
        }
        puVar17 = puVar17 + iVar8;
        uVar18 = uVar18 + 1;
      } while (uVar6 != uVar18);
    }
    iVar7 = iVar7 + uVar20 * iVar19;
    pvVar15 = (void *)((long)pvVar15 + 1);
    iVar8 = *(int *)((long)handle + 0x240);
    pvVar9 = (void *)(ulong)uVar14;
    if ((long)iVar8 <= (long)pvVar15) break;
LAB_0013a86b:
    uVar14 = (uint)pvVar9;
    lVar22 = *(long *)((long)handle + 0x338);
    lVar21 = (long)pvVar15 * 0x60;
    iVar19 = *(int *)(lVar22 + 0x1c + lVar21) * iVar4;
    aiStack_138[(long)pvVar15] = iVar19;
    iVar8 = *(int *)(lVar22 + 0x20 + lVar21);
    iVar5 = tjPlaneWidth((int)pvVar15,*(int *)((long)handle + 0x290),iVar3);
    aiStack_d8[(long)pvVar15] = iVar5;
    uVar6 = tjPlaneHeight((int)pvVar15,*(int *)((long)handle + 0x294),iVar3);
    if (iVar8 * iVar4 != uVar6 || iVar19 != iVar5) {
      uVar14 = 1;
    }
    auStack_108[(long)pvVar15] = uVar6;
    uVar20 = *(int *)(lVar22 + 0xc + lVar21) * iVar4;
    auStack_198[(long)pvVar15] = uVar20;
    pvVar9 = malloc((long)(int)uVar6 << 3);
    local_238[(long)pvVar15 + 10] = (long)pvVar9;
    if (pvVar9 == (void *)0x0) goto LAB_0013aa68;
  }
  bVar23 = uVar14 == 0;
  if (bVar23) {
    pvVar9 = (void *)0x0;
    bVar23 = true;
LAB_0013ab0e:
    iVar7 = _setjmp((__jmp_buf_tag *)((long)handle + 0x528));
    if (iVar7 == 0) {
      if (((uint)flags >> 8 & 1) != 0) {
        *(undefined4 *)((long)handle + 0x26c) = 0;
      }
      if (((uint)flags >> 0xb & 1) != 0) {
        *(undefined4 *)((long)handle + 0x268) = 1;
      }
      *(undefined4 *)((long)handle + 0x264) = 1;
      jpeg_start_decompress(cinfo);
      if (0 < *(int *)((long)handle + 0x294)) {
        iVar7 = *(int *)((long)handle + 0x3a4);
        iVar8 = 0;
        do {
          iVar5 = *(int *)((long)handle + 0x240);
          if (0 < (long)iVar5) {
            lVar21 = 3;
            lVar22 = 0;
            do {
              lVar13 = *(long *)((long)handle + 0x338);
              if (iVar3 == 2) {
                *(int *)(lVar13 + 0x18 + lVar21 * 4) = iVar4;
                iVar19 = *(int *)(lVar13 + lVar21 * 4);
                *(int *)(lVar13 + 0x34 + lVar21 * 4) = (((iVar1 << 4) / iVar2) * iVar19) / iVar7;
                *(undefined8 *)(*(long *)((long)handle + 0x460) + 8 + lVar22 * 2) =
                     *(undefined8 *)(*(long *)((long)handle + 0x460) + 8);
              }
              else {
                iVar19 = *(int *)(lVar13 + lVar21 * 4);
              }
              iVar19 = (iVar19 * iVar8) / iVar7;
              *(int *)((long)aiStack_168 + lVar22) = iVar19;
              if (bVar23) {
                lVar13 = (long)iVar19 * 8 + *(long *)((long)local_238 + lVar22 * 2 + 0x50);
              }
              else {
                lVar13 = *(long *)((long)local_238 + lVar22 * 2);
              }
              *(long *)((long)local_a8 + lVar22 * 2) = lVar13;
              lVar22 = lVar22 + 4;
              lVar21 = lVar21 + 0x18;
            } while ((long)iVar5 * 4 != lVar22);
          }
          jpeg_read_raw_data(cinfo,local_a8,iVar7 * *(int *)((long)handle + 0x3a8));
          if ((!bVar23) && (iVar7 = *(int *)((long)handle + 0x240), 0 < iVar7)) {
            lVar22 = 0;
            do {
              iVar5 = aiStack_168[lVar22];
              uVar6 = auStack_108[lVar22] - iVar5;
              if ((int)auStack_198[lVar22] < (int)uVar6) {
                uVar6 = auStack_198[lVar22];
              }
              if (0 < (int)uVar6) {
                lVar21 = local_238[lVar22];
                iVar7 = aiStack_d8[lVar22];
                lVar13 = local_238[lVar22 + 10];
                uVar18 = 0;
                do {
                  memcpy(*(void **)((long)iVar5 * 8 + lVar13 + uVar18 * 8),
                         *(void **)(lVar21 + uVar18 * 8),(long)iVar7);
                  uVar18 = uVar18 + 1;
                } while (uVar6 != uVar18);
                iVar7 = *(int *)((long)handle + 0x240);
              }
              lVar22 = lVar22 + 1;
            } while (lVar22 < iVar7);
          }
          iVar7 = *(int *)((long)handle + 0x3a4);
          iVar8 = *(int *)((long)handle + 0x3a8) * iVar7 + iVar8;
        } while (iVar8 < *(int *)((long)handle + 0x294));
      }
      jpeg_finish_decompress(cinfo);
      uVar6 = 0;
      goto LAB_0013a544;
    }
  }
  else {
    pvVar9 = malloc((long)iVar7);
    if (pvVar9 != (void *)0x0) {
      if (iVar8 < 1) {
        bVar23 = false;
      }
      else {
        pvVar15 = pvVar9;
        lVar22 = 0;
        do {
          uVar6 = auStack_198[lVar22];
          pvVar12 = malloc((long)(int)uVar6 * 8);
          local_238[lVar22] = (long)pvVar12;
          if (pvVar12 == (void *)0x0) {
            builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
            builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
            builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
            builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
            builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
            builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
            builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
            builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
            *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
            *(undefined4 *)((long)handle + 0x6d0) = 1;
            pcVar16 = (char *)__tls_get_addr(&PTR_0019ef20);
            builtin_strncpy(pcVar16,"tjDecompressToYUVPlanes(): Memory allocation failure",0x35);
            uVar6 = 0xffffffff;
            goto LAB_0013a544;
          }
          if (0 < (int)uVar6) {
            iVar7 = aiStack_138[lVar22];
            lVar21 = 0;
            do {
              *(void **)((long)pvVar12 + lVar21 * 8) = pvVar15;
              pvVar15 = (void *)((long)pvVar15 + (long)iVar7);
              lVar21 = lVar21 + 1;
            } while ((int)uVar6 != lVar21);
          }
          lVar22 = lVar22 + 1;
        } while (lVar22 != iVar8);
      }
      goto LAB_0013ab0e;
    }
LAB_0013aa68:
    builtin_strncpy((char *)((long)handle + 0x628),"y alloca",8);
    builtin_strncpy((char *)((long)handle + 0x630),"tion fai",8);
    builtin_strncpy((char *)((long)handle + 0x618),"VPlanes(",8);
    builtin_strncpy((char *)((long)handle + 0x620),"): Memor",8);
    builtin_strncpy((char *)((long)handle + 0x608),"tjDe",4);
    builtin_strncpy((char *)((long)handle + 0x60c),"comp",4);
    builtin_strncpy((char *)((long)handle + 0x610),"ress",4);
    builtin_strncpy((char *)((long)handle + 0x614),"ToYU",4);
    *(undefined8 *)((long)handle + 0x635) = 0x6572756c696166;
    *(undefined4 *)((long)handle + 0x6d0) = 1;
    pcVar16 = (char *)__tls_get_addr(&PTR_0019ef20);
    builtin_strncpy(pcVar16 + 0x10,"VPlanes(): Memory allocation failure",0x25);
LAB_0013a7d9:
    builtin_strncpy(pcVar16,"tjDecompressToYU",0x10);
LAB_0013a7e0:
    pvVar9 = (void *)0x0;
  }
  uVar6 = 0xffffffff;
LAB_0013a544:
  if (200 < *(int *)((long)handle + 0x22c)) {
    jpeg_abort_decompress(cinfo);
  }
  lVar22 = 0;
  do {
    free((void *)local_238[lVar22]);
    free((void *)local_238[lVar22 + 10]);
    lVar22 = lVar22 + 1;
  } while (lVar22 != 10);
  free(pvVar9);
  *(undefined4 *)((long)handle + 0x5fc) = 0;
  return -(uint)(*(int *)((long)handle + 0x5f8) != 0) | uVar6;
}

Assistant:

DLLEXPORT int tjDecompressToYUVPlanes(tjhandle handle,
                                      const unsigned char *jpegBuf,
                                      unsigned long jpegSize,
                                      unsigned char **dstPlanes, int width,
                                      int *strides, int height, int flags)
{
  int i, sfi, row, retval = 0;
  int jpegwidth, jpegheight, jpegSubsamp, scaledw, scaledh;
  int pw[MAX_COMPONENTS], ph[MAX_COMPONENTS], iw[MAX_COMPONENTS],
    tmpbufsize = 0, usetmpbuf = 0, th[MAX_COMPONENTS];
  JSAMPLE *_tmpbuf = NULL, *ptr;
  JSAMPROW *outbuf[MAX_COMPONENTS], *tmpbuf[MAX_COMPONENTS];
  int dctsize;
  struct my_progress_mgr progress;

  GET_DINSTANCE(handle);
  this->jerr.stopOnWarning = (flags & TJFLAG_STOPONWARNING) ? TRUE : FALSE;

  for (i = 0; i < MAX_COMPONENTS; i++) {
    tmpbuf[i] = NULL;  outbuf[i] = NULL;
  }

  if ((this->init & DECOMPRESS) == 0)
    THROW("tjDecompressToYUVPlanes(): Instance has not been initialized for decompression");

  if (jpegBuf == NULL || jpegSize <= 0 || !dstPlanes || !dstPlanes[0] ||
      width < 0 || height < 0)
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

#ifndef NO_PUTENV
  if (flags & TJFLAG_FORCEMMX) putenv("JSIMD_FORCEMMX=1");
  else if (flags & TJFLAG_FORCESSE) putenv("JSIMD_FORCESSE=1");
  else if (flags & TJFLAG_FORCESSE2) putenv("JSIMD_FORCESSE2=1");
#endif

  if (flags & TJFLAG_LIMITSCANS) {
    MEMZERO(&progress, sizeof(struct my_progress_mgr));
    progress.pub.progress_monitor = my_progress_monitor;
    progress.this = this;
    dinfo->progress = &progress.pub;
  } else
    dinfo->progress = NULL;

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (!this->headerRead) {
    jpeg_mem_src_tj(dinfo, jpegBuf, jpegSize);
    jpeg_read_header(dinfo, TRUE);
  }
  this->headerRead = 0;
  jpegSubsamp = getSubsamp(dinfo);
  if (jpegSubsamp < 0)
    THROW("tjDecompressToYUVPlanes(): Could not determine subsampling type for JPEG image");

  if (jpegSubsamp != TJSAMP_GRAY && (!dstPlanes[1] || !dstPlanes[2]))
    THROW("tjDecompressToYUVPlanes(): Invalid argument");

  jpegwidth = dinfo->image_width;  jpegheight = dinfo->image_height;
  if (width == 0) width = jpegwidth;
  if (height == 0) height = jpegheight;
  for (i = 0; i < NUMSF; i++) {
    scaledw = TJSCALED(jpegwidth, sf[i]);
    scaledh = TJSCALED(jpegheight, sf[i]);
    if (scaledw <= width && scaledh <= height)
      break;
  }
  if (i >= NUMSF)
    THROW("tjDecompressToYUVPlanes(): Could not scale down to desired image dimensions");
  if (dinfo->num_components > 3)
    THROW("tjDecompressToYUVPlanes(): JPEG image must have 3 or fewer components");

  width = scaledw;  height = scaledh;
  dinfo->scale_num = sf[i].num;
  dinfo->scale_denom = sf[i].denom;
  sfi = i;
  jpeg_calc_output_dimensions(dinfo);

  dctsize = DCTSIZE * sf[sfi].num / sf[sfi].denom;

  for (i = 0; i < dinfo->num_components; i++) {
    jpeg_component_info *compptr = &dinfo->comp_info[i];
    int ih;

    iw[i] = compptr->width_in_blocks * dctsize;
    ih = compptr->height_in_blocks * dctsize;
    pw[i] = tjPlaneWidth(i, dinfo->output_width, jpegSubsamp);
    ph[i] = tjPlaneHeight(i, dinfo->output_height, jpegSubsamp);
    if (iw[i] != pw[i] || ih != ph[i]) usetmpbuf = 1;
    th[i] = compptr->v_samp_factor * dctsize;
    tmpbufsize += iw[i] * th[i];
    if ((outbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * ph[i])) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = dstPlanes[i];
    for (row = 0; row < ph[i]; row++) {
      outbuf[i][row] = ptr;
      ptr += (strides && strides[i] != 0) ? strides[i] : pw[i];
    }
  }
  if (usetmpbuf) {
    if ((_tmpbuf = (JSAMPLE *)malloc(sizeof(JSAMPLE) * tmpbufsize)) == NULL)
      THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
    ptr = _tmpbuf;
    for (i = 0; i < dinfo->num_components; i++) {
      if ((tmpbuf[i] = (JSAMPROW *)malloc(sizeof(JSAMPROW) * th[i])) == NULL)
        THROW("tjDecompressToYUVPlanes(): Memory allocation failure");
      for (row = 0; row < th[i]; row++) {
        tmpbuf[i][row] = ptr;
        ptr += iw[i];
      }
    }
  }

  if (setjmp(this->jerr.setjmp_buffer)) {
    /* If we get here, the JPEG code has signaled an error. */
    retval = -1;  goto bailout;
  }

  if (flags & TJFLAG_FASTUPSAMPLE) dinfo->do_fancy_upsampling = FALSE;
  if (flags & TJFLAG_FASTDCT) dinfo->dct_method = JDCT_FASTEST;
  dinfo->raw_data_out = TRUE;

  jpeg_start_decompress(dinfo);
  for (row = 0; row < (int)dinfo->output_height;
       row += dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size) {
    JSAMPARRAY yuvptr[MAX_COMPONENTS];
    int crow[MAX_COMPONENTS];

    for (i = 0; i < dinfo->num_components; i++) {
      jpeg_component_info *compptr = &dinfo->comp_info[i];

      if (jpegSubsamp == TJ_420) {
        /* When 4:2:0 subsampling is used with IDCT scaling, libjpeg will try
           to be clever and use the IDCT to perform upsampling on the U and V
           planes.  For instance, if the output image is to be scaled by 1/2
           relative to the JPEG image, then the scaling factor and upsampling
           effectively cancel each other, so a normal 8x8 IDCT can be used.
           However, this is not desirable when using the decompress-to-YUV
           functionality in TurboJPEG, since we want to output the U and V
           planes in their subsampled form.  Thus, we have to override some
           internal libjpeg parameters to force it to use the "scaled" IDCT
           functions on the U and V planes. */
        compptr->_DCT_scaled_size = dctsize;
        compptr->MCU_sample_width = tjMCUWidth[jpegSubsamp] *
          sf[sfi].num / sf[sfi].denom *
          compptr->v_samp_factor / dinfo->max_v_samp_factor;
        dinfo->idct->inverse_DCT[i] = dinfo->idct->inverse_DCT[0];
      }
      crow[i] = row * compptr->v_samp_factor / dinfo->max_v_samp_factor;
      if (usetmpbuf) yuvptr[i] = tmpbuf[i];
      else yuvptr[i] = &outbuf[i][crow[i]];
    }
    jpeg_read_raw_data(dinfo, yuvptr,
                       dinfo->max_v_samp_factor * dinfo->_min_DCT_scaled_size);
    if (usetmpbuf) {
      int j;

      for (i = 0; i < dinfo->num_components; i++) {
        for (j = 0; j < MIN(th[i], ph[i] - crow[i]); j++) {
          memcpy(outbuf[i][crow[i] + j], tmpbuf[i][j], pw[i]);
        }
      }
    }
  }
  jpeg_finish_decompress(dinfo);

bailout:
  if (dinfo->global_state > DSTATE_START) jpeg_abort_decompress(dinfo);
  for (i = 0; i < MAX_COMPONENTS; i++) {
    free(tmpbuf[i]);
    free(outbuf[i]);
  }
  free(_tmpbuf);
  if (this->jerr.warning) retval = -1;
  this->jerr.stopOnWarning = FALSE;
  return retval;
}